

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

_Bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                (sysbvm_bytecodeJit_t *jit,sysbvm_programEntity_t *programEntity)

{
  _Bool _Var1;
  ulong uVar2;
  size_t entryCount;
  char dot;
  undefined1 local_19;
  
  if (programEntity == (sysbvm_programEntity_t *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                      (jit,(sysbvm_programEntity_t *)programEntity->owner);
    uVar2 = programEntity->name;
    if (((uVar2 & 0xf) == 0 && uVar2 != 0) && ((*(uint *)(uVar2 + 8) & 0x300) == 0x200)) {
      if (_Var1) {
        local_19 = 0x2e;
        sysbvm_dynarray_add(&jit->objectFileContent,&local_19);
        uVar2 = programEntity->name;
      }
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        entryCount = (size_t)*(uint *)(uVar2 + 0xc);
      }
      else {
        entryCount = 0;
      }
      sysbvm_dynarray_addAll(&jit->objectFileContent,entryCount,(void *)(uVar2 + 0x10));
      _Var1 = _Var1 || entryCount != 0;
    }
  }
  return _Var1;
}

Assistant:

static bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName(sysbvm_bytecodeJit_t *jit, sysbvm_programEntity_t *programEntity)
{
    if(!programEntity)
        return false;

    bool hasEmittedName = sysbvm_jit_emitObjectFileProgramEntityRecursiveName(jit, (sysbvm_programEntity_t*)programEntity->owner);
    if(sysbvm_tuple_isBytes(programEntity->name))
    {
        if(hasEmittedName)
        {
            char dot = '.';
            sysbvm_dynarray_add(&jit->objectFileContent, &dot);
        }
        size_t byteSize = sysbvm_tuple_getSizeInBytes(programEntity->name);
        sysbvm_dynarray_addAll(&jit->objectFileContent, byteSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(programEntity->name)->bytes);
        hasEmittedName = hasEmittedName || byteSize > 0;
    }

    return hasEmittedName;
}